

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpfaketransmitter.cpp
# Opt level: O3

RTPRawPacket * __thiscall jrtplib::RTPFakeTransmitter::GetNextPacket(RTPFakeTransmitter *this)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  RTPRawPacket *pRVar3;
  
  if (((this->init == true) && (this->created == true)) &&
     (p_Var2 = (this->rawpacketlist).
               super__List_base<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>.
               _M_impl._M_node.super__List_node_base._M_next,
     p_Var2 != (_List_node_base *)&this->rawpacketlist)) {
    pRVar3 = (RTPRawPacket *)p_Var2[1]._M_next;
    psVar1 = &(this->rawpacketlist).
              super__List_base<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>.
              _M_impl._M_node._M_size;
    *psVar1 = *psVar1 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var2,0x18);
  }
  else {
    pRVar3 = (RTPRawPacket *)0x0;
  }
  return pRVar3;
}

Assistant:

RTPRawPacket *RTPFakeTransmitter::GetNextPacket()
{
	if (!init)
		return 0;
	
	MAINMUTEX_LOCK
	
	RTPRawPacket *p;
	
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return 0;
	}
	if (rawpacketlist.empty())
	{
		MAINMUTEX_UNLOCK
		return 0;
	}

	p = *(rawpacketlist.begin());
	rawpacketlist.pop_front();

	MAINMUTEX_UNLOCK
	return p;
}